

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

Matrix33 *
AML::eulerAngleRatesMatrix_ZYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double data [3] [3];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 local_30;
  double local_28;
  double local_20;
  undefined8 local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  local_48 = sin(theta);
  local_20 = 1.0 / local_48;
  local_58 = dVar1 * dVar3 * local_20;
  local_50 = -dVar2 * dVar3 * local_20;
  local_40 = dVar2 * local_48 * local_20;
  local_38 = local_48 * dVar1 * local_20;
  local_30 = 0;
  local_28 = -dVar1 * local_20;
  local_20 = local_20 * dVar2;
  local_18 = 0;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_ZYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cscTheta = 1.0 / sinTheta;

        double data[3][3] = { { cosPhi * cosTheta * cscTheta, -sinPhi * cosTheta * cscTheta, sinTheta },
                              { sinPhi * sinTheta * cscTheta, cosPhi * sinTheta * cscTheta, 0.0 },
                              { -cosPhi * cscTheta, sinPhi * cscTheta, 0.0 } };

        return Matrix33(data);
    }